

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::Socket_testFailConnectURI_Test::TestBody(Socket_testFailConnectURI_Test *this)

{
  bool bVar1;
  byte bVar2;
  socklen_t in_ECX;
  AssertHelper local_198 [8];
  Message local_190 [16];
  runtime_error *anon_var_0;
  Socket local_178 [8];
  byte local_e9;
  char *pcStack_e8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_d8 [32];
  URI uri;
  undefined1 local_20 [8];
  Socket socket;
  Socket_testFailConnectURI_Test *this_local;
  
  socket._8_8_ = this;
  Socket::Socket((Socket *)local_20);
  Socket::open((Socket *)local_20,(char *)0x2,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d8,"http://127.0.0.1:12345",(allocator *)((long)&gtest_msg.value + 7));
  jaegertracing::net::URI::parse((string *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff18,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff18);
  if (bVar1) {
    local_e9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      Socket::connect(local_178,(int)local_20,(sockaddr *)&stack0xffffffffffffff48,in_ECX);
    }
    if ((local_e9 & 1) != 0) {
      anon_var_0._4_4_ = 0;
      goto LAB_002bd072;
    }
    pcStack_e8 = 
    "Expected: socket.connect(uri) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_190);
  testing::internal::AssertHelper::AssertHelper
            (local_198,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x38,pcStack_e8);
  testing::internal::AssertHelper::operator=(local_198,local_190);
  testing::internal::AssertHelper::~AssertHelper(local_198);
  testing::Message::~Message(local_190);
  anon_var_0._4_4_ = 1;
LAB_002bd072:
  URI::~URI((URI *)&stack0xffffffffffffff48);
  Socket::~Socket((Socket *)local_20);
  return;
}

Assistant:

TEST(Socket, testFailConnectURI)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    const auto uri = URI::parse("http://127.0.0.1:12345");
    ASSERT_THROW(socket.connect(uri), std::runtime_error);
}